

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_odc.c
# Opt level: O0

ssize_t archive_write_odc_data(archive_write *a,void *buff,size_t s)

{
  ulong *puVar1;
  int iVar2;
  int ret;
  cpio_conflict *cpio;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  puVar1 = (ulong *)a->format_data;
  cpio = (cpio_conflict *)s;
  if (*puVar1 < s) {
    cpio = (cpio_conflict *)*puVar1;
  }
  iVar2 = __archive_write_output(a,buff,(size_t)cpio);
  *puVar1 = *puVar1 - (long)cpio;
  if (iVar2 < 0) {
    a_local = (archive_write *)(long)iVar2;
  }
  else {
    a_local = (archive_write *)cpio;
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
archive_write_odc_data(struct archive_write *a, const void *buff, size_t s)
{
	struct cpio *cpio;
	int ret;

	cpio = (struct cpio *)a->format_data;
	if (s > cpio->entry_bytes_remaining)
		s = (size_t)cpio->entry_bytes_remaining;

	ret = __archive_write_output(a, buff, s);
	cpio->entry_bytes_remaining -= s;
	if (ret >= 0)
		return (s);
	else
		return (ret);
}